

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O1

FieldDescriptor * __thiscall
google::protobuf::Message::_InternalParse::ReflectiveFieldParser::Field
          (ReflectiveFieldParser *this,int num,int wire_type)

{
  DescriptorPool *this_00;
  FieldDescriptor *pFVar1;
  ExtensionRange *pEVar2;
  bool bVar3;
  FieldDescriptor *local_30;
  _func_void_FieldDescriptor_ptr *local_28;
  
  pFVar1 = Descriptor::FindFieldByNumber(this->descriptor_,num);
  if (pFVar1 == (FieldDescriptor *)0x0) {
    pEVar2 = Descriptor::FindExtensionRangeContainingNumber(this->descriptor_,num);
    if (pEVar2 == (ExtensionRange *)0x0) {
      pFVar1 = (FieldDescriptor *)0x0;
    }
    else {
      this_00 = (this->ctx_->data_).pool;
      if (this_00 == (DescriptorPool *)0x0) {
        pFVar1 = Reflection::FindKnownExtensionByNumber(this->reflection_,num);
      }
      else {
        pFVar1 = DescriptorPool::FindExtensionByNumber(this_00,this->descriptor_,num);
      }
    }
  }
  if (pFVar1 == (FieldDescriptor *)0x0) {
    pFVar1 = (FieldDescriptor *)0x0;
  }
  else {
    if (*(once_flag **)(pFVar1 + 0x30) != (once_flag *)0x0) {
      local_28 = FieldDescriptor::TypeOnceInit;
      local_30 = pFVar1;
      std::
      call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (*(once_flag **)(pFVar1 + 0x30),&local_28,&local_30);
    }
    if (*(int *)(internal::WireFormatLite::kWireTypeForFieldType +
                (ulong)*(uint *)(pFVar1 + 0x38) * 4) != wire_type) {
      if (*(int *)(pFVar1 + 0x3c) == 3) {
        if (*(once_flag **)(pFVar1 + 0x30) != (once_flag *)0x0) {
          local_28 = FieldDescriptor::TypeOnceInit;
          local_30 = pFVar1;
          std::
          call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                    (*(once_flag **)(pFVar1 + 0x30),&local_28,&local_30);
        }
        bVar3 = *(int *)(pFVar1 + 0x38) - 0xdU < 0xfffffffc;
      }
      else {
        bVar3 = false;
      }
      if (!bVar3) {
        pFVar1 = (FieldDescriptor *)0x0;
      }
      if (wire_type != 2) {
        pFVar1 = (FieldDescriptor *)0x0;
      }
    }
  }
  return pFVar1;
}

Assistant:

const FieldDescriptor* Field(int num, int wire_type) {
      auto field = descriptor_->FindFieldByNumber(num);

      // If that failed, check if the field is an extension.
      if (field == nullptr && descriptor_->IsExtensionNumber(num)) {
        const DescriptorPool* pool = ctx_->data().pool;
        if (pool == NULL) {
          field = reflection_->FindKnownExtensionByNumber(num);
        } else {
          field = pool->FindExtensionByNumber(descriptor_, num);
        }
      }
      if (field == nullptr) return nullptr;

      if (internal::WireFormat::WireTypeForFieldType(field->type()) !=
          wire_type) {
        if (field->is_packable()) {
          if (wire_type ==
              internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
            return field;
          }
        }
        return nullptr;
      }
      return field;
    }